

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadstorage.cpp
# Opt level: O0

void ** __thiscall QThreadStorageData::get(QThreadStorageData *this)

{
  QThreadData *pQVar1;
  qsizetype qVar2;
  int *in_RDI;
  long in_FS_OFFSET;
  void **v;
  QList<void_*> *tls;
  QThreadData *data;
  char *in_stack_ffffffffffffff98;
  QList<void_*> *in_stack_ffffffffffffffa0;
  QMessageLogger *in_stack_ffffffffffffffb0;
  reference local_30;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QThreadData::current();
  if (pQVar1 == (QThreadData *)0x0) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffb0,(char *)in_RDI,
               (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),in_stack_ffffffffffffff98);
    QMessageLogger::warning
              (&local_28,
               "QThreadStorage::get: QThreadStorage can only be used with threads started with QThread"
              );
    local_30 = (reference)0x0;
  }
  else {
    qVar2 = QList<void_*>::size(&pQVar1->tls);
    if (qVar2 <= *in_RDI) {
      QList<void_*>::resize((QList<void_*> *)in_stack_ffffffffffffffb0,(qsizetype)in_RDI);
    }
    local_30 = QList<void_*>::operator[]
                         (in_stack_ffffffffffffffa0,(qsizetype)in_stack_ffffffffffffff98);
    if (*local_30 == (void *)0x0) {
      local_30 = (reference)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

void **QThreadStorageData::get() const
{
    QThreadData *data = QThreadData::current();
    if (!data) {
        qWarning("QThreadStorage::get: QThreadStorage can only be used with threads started with QThread");
        return nullptr;
    }
    QList<void *> &tls = data->tls;
    if (tls.size() <= id)
        tls.resize(id + 1);
    void **v = &tls[id];

    DEBUG_MSG("QThreadStorageData: Returning storage %d, data %p, for thread %p",
          id,
          *v,
          data->thread.loadRelaxed());

    return *v ? v : nullptr;
}